

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbasictimer.cpp
# Opt level: O0

void __thiscall QBasicTimer::stop(QBasicTimer *this)

{
  bool bVar1;
  QAbstractEventDispatcher *this_00;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QAbstractEventDispatcher *eventDispatcher;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *this_01;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = isActive((QBasicTimer *)in_RDI);
  if (bVar1) {
    this_00 = QAbstractEventDispatcher::instance((QThread *)in_RDI);
    if ((this_00 != (QAbstractEventDispatcher *)0x0) &&
       (bVar1 = QAbstractEventDispatcher::unregisterTimer(this_00,(TimerId)((ulong)in_RDI >> 0x20)),
       !bVar1)) {
      QMessageLogger::QMessageLogger
                (this_01,(char *)this_00,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
      QMessageLogger::warning
                (&local_28,
                 "QBasicTimer::stop: Failed. Possibly trying to stop from a different thread");
      goto LAB_00335bba;
    }
    QAbstractEventDispatcherPrivate::releaseTimerId(Invalid);
  }
  (in_RDI->context).version = 0;
LAB_00335bba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBasicTimer::stop()
{
    if (isActive()) {
        QAbstractEventDispatcher *eventDispatcher = QAbstractEventDispatcher::instance();
        if (eventDispatcher && !eventDispatcher->unregisterTimer(m_id)) {
            qWarning("QBasicTimer::stop: Failed. Possibly trying to stop from a different thread");
            return;
        }
        QAbstractEventDispatcherPrivate::releaseTimerId(m_id);
    }
    m_id = Qt::TimerId::Invalid;
}